

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

Result __thiscall
soplex::SPxMainSM<double>::removeEmpty(SPxMainSM<double> *this,SPxLPBase<double> *lp)

{
  VectorBase<double> *pVVar1;
  long lVar2;
  double dVar3;
  int *piVar4;
  SPxOut *pSVar5;
  int iVar6;
  char cVar7;
  bool bVar8;
  int iVar9;
  VectorBase<double> *pVVar10;
  EmptyConstraintPS *pEVar11;
  FixVariablePS *this_00;
  long lVar12;
  long lVar13;
  long lVar14;
  long in_FS_OFFSET;
  double dVar15;
  double dVar16;
  shared_ptr<soplex::SPxMainSM<double>::PostStep> ptr;
  shared_ptr<soplex::SPxMainSM<double>::PostStep> ptr2;
  double local_100;
  Result local_e4;
  int local_d4;
  value_type local_d0;
  ulong local_c0;
  Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *local_b8;
  VectorBase<double> *local_b0;
  value_type local_a8;
  shared_ptr<soplex::Tolerances> local_98;
  shared_ptr<soplex::Tolerances> local_88;
  shared_ptr<soplex::Tolerances> local_78;
  long local_68;
  long local_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  iVar9 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  lVar13 = (long)iVar9;
  local_b8 = &this->m_hist;
  iVar9 = iVar9 + -1;
  local_c0 = lVar13 * 4 - 4;
  lVar12 = 0;
  local_d4 = 0;
  do {
    lVar14 = lVar13 + lVar12;
    if (lVar14 < 1) break;
    bVar8 = true;
    if ((lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem
        [(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[lVar13 + lVar12 + -1].
         idx].data.super_SVectorBase<double>.memused == 0) {
      dVar3 = (lp->super_LPRowSetBase<double>).right.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar13 + lVar12 + -1];
      dVar15 = feastol(this);
      if ((dVar3 < -dVar15) ||
         (dVar3 = (lp->super_LPRowSetBase<double>).left.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar13 + lVar12 + -1], dVar15 = feastol(this),
         dVar15 < dVar3)) {
        bVar8 = false;
      }
      else {
        pEVar11 = (EmptyConstraintPS *)operator_new(0x38);
        local_78.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (this->super_SPxSimplifier<double>)._tolerances.
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_78.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (this->super_SPxSimplifier<double>)._tolerances.
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        if (local_78.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_78.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi)->_M_use_count =
                 (local_78.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_78.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi)->_M_use_count =
                 (local_78.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        EmptyConstraintPS::EmptyConstraintPS(pEVar11,lp,iVar9 + (int)lVar12,&local_78);
        local_d0.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)pEVar11;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<soplex::SPxMainSM<double>::EmptyConstraintPS*>
                  (&local_d0.
                    super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,pEVar11);
        if (local_78.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_78.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        std::
        vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
        ::push_back(&local_b8->data,&local_d0);
        piVar4 = (this->m_rIdx).data;
        *(int *)((long)piVar4 + lVar12 * 4 + local_c0) =
             piVar4[(long)(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum + -1];
        (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0xf])
                  (lp,(ulong)(uint)(iVar9 + (int)lVar12));
        piVar4 = (this->m_stat).data;
        *piVar4 = *piVar4 + 1;
        if (local_d0.
            super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_d0.
                     super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        local_d4 = local_d4 + 1;
        bVar8 = true;
      }
    }
    lVar12 = lVar12 + -1;
  } while (bVar8);
  local_e4 = INFEASIBLE;
  if (lVar14 < 1) {
    iVar9 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
    lVar13 = (long)iVar9;
    local_b0 = &(lp->super_LPColSetBase<double>).low;
    pVVar1 = &(lp->super_LPColSetBase<double>).up;
    local_48 = *(double *)(in_FS_OFFSET + -8);
    uStack_40 = 0;
    local_58 = -local_48;
    uStack_50 = 0x8000000000000000;
    iVar9 = iVar9 + -1;
    local_68 = lVar13 * 4 + -4;
    local_e4 = INFEASIBLE;
    lVar14 = 0;
    local_c0 = local_c0 & 0xffffffff00000000;
    lVar12 = lVar13;
    local_60 = lVar13;
    do {
      lVar2 = lVar12 + lVar14;
      if (lVar2 < 1) break;
      bVar8 = true;
      if ((lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem
          [(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[lVar13 + lVar14 + -1]
           .idx].data.super_SVectorBase<double>.memused == 0) {
        dVar3 = (lp->super_LPColSetBase<double>).object.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar13 + lVar14 + -1];
        dVar15 = epsZero(this);
        if (dVar3 <= dVar15) {
          dVar3 = (lp->super_LPColSetBase<double>).object.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar13 + lVar14 + -1];
          dVar16 = epsZero(this);
          dVar15 = (lp->super_LPColSetBase<double>).low.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar13 + lVar14 + -1];
          if (-dVar16 <= dVar3) {
            ::soplex::infinity::__tls_init();
            pVVar10 = local_b0;
            if (local_58 < dVar15) goto LAB_001fe66c;
            dVar3 = (pVVar1->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar13 + lVar14 + -1];
            ::soplex::infinity::__tls_init();
            local_100 = 0.0;
            pVVar10 = pVVar1;
            if (dVar3 < local_48) goto LAB_001fe66c;
          }
          else {
            ::soplex::infinity::__tls_init();
            pVVar10 = local_b0;
            if (dVar15 <= local_58) goto LAB_001fe5e7;
LAB_001fe66c:
            local_100 = (pVVar10->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar13 + lVar14 + -1];
          }
          pEVar11 = (EmptyConstraintPS *)operator_new(0x30);
          local_88.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (this->super_SPxSimplifier<double>)._tolerances.
               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_88.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (this->super_SPxSimplifier<double>)._tolerances.
                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
          if (local_88.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_88.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_88.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_88.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_88.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          iVar6 = (int)lVar14;
          FixBoundsPS::FixBoundsPS((FixBoundsPS *)pEVar11,lp,iVar9 + iVar6,local_100,&local_88);
          local_d0.
          super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)pEVar11;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<soplex::SPxMainSM<double>::FixBoundsPS*>
                    (&local_d0.
                      super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,(FixBoundsPS *)pEVar11);
          if (local_88.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_88.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          this_00 = (FixVariablePS *)operator_new(0x78);
          local_98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (this->super_SPxSimplifier<double>)._tolerances.
               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (this->super_SPxSimplifier<double>)._tolerances.
                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
          if (local_98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          FixVariablePS::FixVariablePS(this_00,lp,this,iVar9 + iVar6,local_100,&local_98,true);
          local_a8.
          super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)this_00;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<soplex::SPxMainSM<double>::FixVariablePS*>
                    (&local_a8.
                      super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,this_00);
          if (local_98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_98.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          std::
          vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
          ::push_back(&local_b8->data,&local_d0);
          lVar12 = local_60;
          std::
          vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
          ::push_back(&local_b8->data,&local_a8);
          piVar4 = (this->m_cIdx).data;
          *(int *)((long)piVar4 + lVar14 * 4 + local_68) =
               piVar4[(long)(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum + -1
                     ];
          (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
            super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x15])
                    (lp,(ulong)(uint)(iVar9 + iVar6));
          piVar4 = (this->m_stat).data + 4;
          *piVar4 = *piVar4 + 1;
          if (local_a8.
              super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_a8.
                       super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_d0.
              super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_d0.
                       super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          local_c0 = CONCAT44(local_c0._4_4_,(int)local_c0 + 1);
          bVar8 = true;
        }
        else {
          dVar3 = (pVVar1->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar13 + lVar14 + -1];
          ::soplex::infinity::__tls_init();
          pVVar10 = pVVar1;
          if (dVar3 < local_48) goto LAB_001fe66c;
LAB_001fe5e7:
          local_e4 = UNBOUNDED;
          bVar8 = false;
        }
      }
      lVar14 = lVar14 + -1;
    } while (bVar8);
    if (lVar2 < 1) {
      local_e4 = OKAY;
      iVar9 = (int)local_c0;
      if ((int)local_c0 + local_d4 != 0 &&
          SCARRY4((int)local_c0,local_d4) == (int)local_c0 + local_d4 < 0) {
        piVar4 = &(this->super_SPxSimplifier<double>).m_remRows;
        *piVar4 = *piVar4 + local_d4;
        piVar4 = &(this->super_SPxSimplifier<double>).m_remCols;
        *piVar4 = *piVar4 + (int)local_c0;
        pSVar5 = (this->super_SPxSimplifier<double>).spxout;
        if ((pSVar5 != (SPxOut *)0x0) && (3 < (int)pSVar5->m_verbosity)) {
          local_d0.
          super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)
                 CONCAT44(local_d0.
                          super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr._4_4_,pSVar5->m_verbosity);
          local_a8.
          super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)
                 CONCAT44(local_a8.
                          super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr._4_4_,4);
          (*pSVar5->_vptr_SPxOut[2])();
          pSVar5 = (this->super_SPxSimplifier<double>).spxout;
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar5->m_streams[pSVar5->m_verbosity],
                     "Simplifier (empty rows/colums) removed ",0x27);
          std::ostream::operator<<((ostream *)pSVar5->m_streams[pSVar5->m_verbosity],local_d4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar5->m_streams[pSVar5->m_verbosity]," rows, ",7);
          std::ostream::operator<<((ostream *)pSVar5->m_streams[pSVar5->m_verbosity],iVar9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (pSVar5->m_streams[pSVar5->m_verbosity]," cols",5);
          cVar7 = (char)pSVar5->m_streams[pSVar5->m_verbosity];
          std::ios::widen((char)*(undefined8 *)
                                 (*(long *)pSVar5->m_streams[pSVar5->m_verbosity] + -0x18) + cVar7);
          std::ostream::put(cVar7);
          std::ostream::flush();
          pSVar5 = (this->super_SPxSimplifier<double>).spxout;
          (*pSVar5->_vptr_SPxOut[2])(pSVar5,&local_d0);
          local_e4 = OKAY;
        }
      }
    }
  }
  return local_e4;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::removeEmpty(SPxLPBase<R>& lp)
{

   // This method removes empty rows and columns from the LP.

   int remRows = 0;
   int remCols = 0;

   for(int i = lp.nRows() - 1; i >= 0; --i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);

      if(row.size() == 0)
      {
         SPxOut::debug(this, "IMAISM07 row {}: empty ->", i);

         if(LT(lp.rhs(i), R(0.0), feastol()) || GT(lp.lhs(i), R(0.0), feastol()))
         {
            SPxOut::debug(this, " infeasible lhs={} rhs={}\n", lp.lhs(i), lp.rhs(i));
            return this->INFEASIBLE;
         }

         SPxOut::debug(this, " removed\n");

         std::shared_ptr<PostStep> ptr(new EmptyConstraintPS(lp, i, this->_tolerances));
         m_hist.append(ptr);

         ++remRows;
         removeRow(lp, i);

         ++m_stat[EMPTY_ROW];
      }
   }

   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      const SVectorBase<R>& col = lp.colVector(j);

      if(col.size() == 0)
      {
         SPxOut::debug(this, "IMAISM08 col {}: empty -> maxObj={} lower={} upper={}", j, lp.maxObj(j),
                       lp.lower(j), lp.upper(j));

         R val;

         if(GT(lp.maxObj(j), R(0.0), this->epsZero()))
         {
            if(lp.upper(j) >= R(infinity))
            {
               SPxOut::debug(this, " unbounded\n");
               return this->UNBOUNDED;
            }

            val = lp.upper(j);
         }
         else if(LT(lp.maxObj(j), R(0.0), this->epsZero()))
         {
            if(lp.lower(j) <= R(-infinity))
            {
               SPxOut::debug(this, " unbounded\n");
               return this->UNBOUNDED;
            }

            val = lp.lower(j);
         }
         else
         {
            SOPLEX_ASSERT_WARN("WMAISM09", isZero(lp.maxObj(j), this->epsZero()));

            // any value within the bounds is ok
            if(lp.lower(j) > R(-infinity))
               val = lp.lower(j);
            else if(lp.upper(j) < R(infinity))
               val = lp.upper(j);
            else
               val = 0.0;
         }

         SPxOut::debug(this, " removed\n");

         std::shared_ptr<PostStep> ptr1(new FixBoundsPS(lp, j, val, this->_tolerances));
         std::shared_ptr<PostStep> ptr2(new FixVariablePS(lp, *this, j, val, this->_tolerances));
         m_hist.append(ptr1);
         m_hist.append(ptr2);

         ++remCols;
         removeCol(lp, j);

         ++m_stat[EMPTY_COL];
      }
   }

   if(remRows + remCols > 0)
   {
      this->m_remRows += remRows;
      this->m_remCols += remCols;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (empty rows/colums) removed "
                    << remRows << " rows, "
                    << remCols << " cols"
                    << std::endl;)

   }

   return this->OKAY;
}